

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findClique.cpp
# Opt level: O1

void maxCliqueHelper(CGraphIO *gio,vector<int,_std::allocator<int>_> *U,int sizeOfClique,int *maxClq
                    ,vector<int,_std::allocator<int>_> *max_clique_data_inter)

{
  vector<int,_std::allocator<int>_> *ptrVtx;
  iterator __position;
  vector<int,std::allocator<int>> *this;
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  ulong uVar5;
  int index;
  vector<int,_std::allocator<int>_> U_new;
  int local_6c;
  vector<int,std::allocator<int>> *local_68;
  int local_5c;
  vector<int,_std::allocator<int>_> local_58;
  long local_38;
  
  local_6c = 0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_68 = (vector<int,std::allocator<int>> *)max_clique_data_inter;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_58,
             ((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
  if ((U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      == (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
     ) {
    if (*maxClq < sizeOfClique) {
      *maxClq = sizeOfClique;
      if (*(pointer *)(local_68 + 8) != *(pointer *)local_68) {
        *(pointer *)(local_68 + 8) = *(pointer *)local_68;
      }
    }
  }
  else {
    piVar3 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar2 != piVar3) {
      ptrVtx = &gio->m_vi_Vertices;
      local_38 = (long)sizeOfClique;
      local_5c = sizeOfClique + 1;
      do {
        if ((ulong)(((long)piVar2 - (long)piVar3 >> 2) + local_38) <= (ulong)(long)*maxClq) break;
        local_6c = piVar2[-1];
        (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
             = piVar2 + -1;
        piVar3 = (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[local_6c];
        lVar4 = (long)iVar1;
        if (iVar1 < piVar3[(long)local_6c + 1]) {
          do {
            iVar1 = getDegree(ptrVtx,(gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar4]);
            if (iVar1 < *maxClq) {
              pruned3 = pruned3 + 1;
            }
            else {
              piVar3 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                  ._M_finish != piVar3) {
                uVar5 = 0;
                do {
                  piVar2 = (gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar1 = piVar2[lVar4];
                  if (iVar1 == piVar3[uVar5]) {
                    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_58,
                                 (iterator)
                                 local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,piVar2 + lVar4);
                    }
                    else {
                      *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = iVar1;
                      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  uVar5 = uVar5 + 1;
                  piVar3 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                } while (uVar5 < (ulong)((long)(U->super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish -
                                         (long)piVar3 >> 2));
              }
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[(long)local_6c + 1]);
        }
        this = local_68;
        iVar1 = *maxClq;
        maxCliqueHelper(gio,&local_58,local_5c,maxClq,(vector<int,_std::allocator<int>_> *)local_68)
        ;
        if (iVar1 < *maxClq) {
          __position._M_current = *(int **)(this + 8);
          if (__position._M_current == *(int **)(this + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this,__position,&local_6c);
          }
          else {
            *__position._M_current = local_6c;
            *(int **)(this + 8) = __position._M_current + 1;
          }
        }
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        piVar3 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
        piVar2 = (U->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish;
      } while (piVar2 != piVar3);
    }
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void maxCliqueHelper( CGraphIO& gio, vector<int>* U, int sizeOfClique, int& maxClq, vector<int>& max_clique_data_inter )
{
	int iPos, index = 0, maxClq_prev;
	vector <int>* ptrVertex = gio.GetVerticesPtr();
	vector <int>* ptrEdge = gio.GetEdgesPtr();
	vector <int> U_new;
   U_new.reserve(gio.GetVertexCount());

	if( U->size() == 0  )
	{
		if( sizeOfClique > maxClq )
		{
			maxClq = sizeOfClique;
         max_clique_data_inter.clear();
		}
		return;
	}

	while( U->size() > 0 )
	{
		//Old Pruning
		if( sizeOfClique + U->size() <= maxClq )
			return;

		index = U->back();
		U->pop_back();

		// Loop over neighbrs of v_index.
		for(int j = (*ptrVertex)[index]; j < (*ptrVertex)[index + 1]; j++ )
			//Pruning 5
			if( getDegree(ptrVertex, (*ptrEdge)[j]) >=  maxClq )
			{
				// Loop over U.
				for(int i = 0; i < U->size(); i++)
				{
					if( (*ptrEdge)[j] == (*U)[i] )
						U_new.push_back( (*ptrEdge)[j]);
				}
			}
			else
				pruned3++;

      maxClq_prev = maxClq;

      maxCliqueHelper( gio, &U_new, sizeOfClique + 1, maxClq, max_clique_data_inter );

      if(maxClq > maxClq_prev)
         max_clique_data_inter.push_back(index);

		U_new.clear();
	}
}